

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::IfExceptExpr::IfExceptExpr(IfExceptExpr *this,Location *loc)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  Location local_48;
  
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr.super_intrusive_list_base<wabt::Expr>.next_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr.super_intrusive_list_base<wabt::Expr>.prev_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__Expr_013e1990;
  sVar1 = (loc->filename).size_;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr.loc.filename.data_ = (loc->filename).data_;
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr.loc.filename.size_ = sVar1;
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr.loc.field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(this->super_ExprMixin<(wabt::ExprType)20>).super_Expr.loc.field_1 + 8) =
       uVar3;
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ = IfExcept;
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__IfExceptExpr_013e1f88;
  Block::Block(&this->true_);
  (this->false_end_loc).filename.size_ = 0;
  (this->false_end_loc).field_1.field_1.offset = 0;
  (this->false_).size_ = 0;
  (this->false_end_loc).filename.data_ = (char *)0x0;
  (this->false_end_loc).field_1.field_0.last_column = 0;
  (this->false_).first_ = (Expr *)0x0;
  (this->false_).last_ = (Expr *)0x0;
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  Var::Var(&this->except_var,0xffffffff,&local_48);
  return;
}

Assistant:

explicit IfExceptExpr(const Location& loc = Location())
      : ExprMixin<ExprType::IfExcept>(loc) {}